

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_self_test(int verbose)

{
  int iVar1;
  long lVar2;
  uchar (*pauVar3) [16];
  char *pcVar4;
  uint uVar5;
  uchar *__s2;
  size_t __n;
  uchar (*pauVar6) [48];
  uchar (*pauVar7) [48];
  uint uVar8;
  uint mode;
  uint uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t offset;
  uchar buf [64];
  uchar iv [16];
  uchar key [32];
  uchar prv [16];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  uchar tmp [16];
  size_t local_210;
  undefined1 local_208 [16];
  uchar local_1f8 [48];
  undefined1 local_1c8 [16];
  uchar local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined8 local_188;
  undefined8 uStack_180;
  uchar local_178 [16];
  mbedtls_aes_context local_168;
  
  local_1b8[0] = '\0';
  local_1b8[1] = '\0';
  local_1b8[2] = '\0';
  local_1b8[3] = '\0';
  local_1b8[4] = '\0';
  local_1b8[5] = '\0';
  local_1b8[6] = '\0';
  local_1b8[7] = '\0';
  local_1b8[8] = '\0';
  local_1b8[9] = '\0';
  local_1b8[10] = '\0';
  local_1b8[0xb] = '\0';
  local_1b8[0xc] = '\0';
  local_1b8[0xd] = '\0';
  local_1b8[0xe] = '\0';
  local_1b8[0xf] = '\0';
  local_1a8 = (undefined1  [16])0x0;
  memset(&local_168,0,0x120);
  uVar9 = 0;
  do {
    uVar8 = (uVar9 >> 1) * 0x40 + 0x80;
    uVar5 = uVar9 & 1;
    if (verbose != 0) {
      pcVar4 = "enc";
      if (uVar5 == 0) {
        pcVar4 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)uVar8,pcVar4);
    }
    local_208 = (undefined1  [16])0x0;
    if (uVar5 == 0) {
      iVar1 = mbedtls_aes_setkey_dec(&local_168,local_1b8,uVar8);
      pauVar3 = aes_test_ecb_dec;
    }
    else {
      iVar1 = mbedtls_aes_setkey_enc(&local_168,local_1b8,uVar8);
      pauVar3 = aes_test_ecb_enc;
    }
    pcVar4 = "skipped";
    if (uVar8 == 0xc0 && iVar1 == -0x23) {
LAB_0010a922:
      puts(pcVar4);
    }
    else {
      if (iVar1 != 0) goto LAB_0010ada4;
      pauVar3 = pauVar3 + (uVar9 >> 1);
      iVar10 = 10000;
      do {
        iVar1 = mbedtls_aes_crypt_ecb(&local_168,uVar5,local_208,local_208);
        if (iVar1 != 0) goto LAB_0010ada4;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      auVar11[0] = -((*pauVar3)[0] == local_208[0]);
      auVar11[1] = -((*pauVar3)[1] == local_208[1]);
      auVar11[2] = -((*pauVar3)[2] == local_208[2]);
      auVar11[3] = -((*pauVar3)[3] == local_208[3]);
      auVar11[4] = -((*pauVar3)[4] == local_208[4]);
      auVar11[5] = -((*pauVar3)[5] == local_208[5]);
      auVar11[6] = -((*pauVar3)[6] == local_208[6]);
      auVar11[7] = -((*pauVar3)[7] == local_208[7]);
      auVar11[8] = -((*pauVar3)[8] == local_208[8]);
      auVar11[9] = -((*pauVar3)[9] == local_208[9]);
      auVar11[10] = -((*pauVar3)[10] == local_208[10]);
      auVar11[0xb] = -((*pauVar3)[0xb] == local_208[0xb]);
      auVar11[0xc] = -((*pauVar3)[0xc] == local_208[0xc]);
      auVar11[0xd] = -((*pauVar3)[0xd] == local_208[0xd]);
      auVar11[0xe] = -((*pauVar3)[0xe] == local_208[0xe]);
      auVar11[0xf] = -((*pauVar3)[0xf] == local_208[0xf]);
      if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010ade4;
      pcVar4 = "passed";
      if (verbose != 0) goto LAB_0010a922;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar9 = 0;
  do {
    uVar5 = (uVar9 >> 1) * 0x40 + 0x80;
    uVar8 = uVar9 & 1;
    if (verbose != 0) {
      pcVar4 = "enc";
      if (uVar8 == 0) {
        pcVar4 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)uVar5,pcVar4);
    }
    local_1c8 = (undefined1  [16])0x0;
    local_198 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    if (uVar8 == 0) {
      iVar1 = mbedtls_aes_setkey_dec(&local_168,local_1b8,uVar5);
      pauVar3 = aes_test_cbc_dec;
    }
    else {
      iVar1 = mbedtls_aes_setkey_enc(&local_168,local_1b8,uVar5);
      pauVar3 = aes_test_cbc_enc;
    }
    pcVar4 = "skipped";
    if (uVar5 == 0xc0 && iVar1 == -0x23) {
LAB_0010aa87:
      puts(pcVar4);
    }
    else {
      if (iVar1 != 0) goto LAB_0010ada4;
      pauVar3 = pauVar3 + (uVar9 >> 1);
      iVar10 = 10000;
      do {
        auVar11 = local_198;
        if (uVar8 != 0) {
          local_198 = local_208;
          local_208 = auVar11;
        }
        iVar1 = mbedtls_aes_crypt_cbc(&local_168,uVar8,0x10,local_1c8,local_208,local_208);
        if (iVar1 != 0) goto LAB_0010ada4;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      auVar12[0] = -((*pauVar3)[0] == local_208[0]);
      auVar12[1] = -((*pauVar3)[1] == local_208[1]);
      auVar12[2] = -((*pauVar3)[2] == local_208[2]);
      auVar12[3] = -((*pauVar3)[3] == local_208[3]);
      auVar12[4] = -((*pauVar3)[4] == local_208[4]);
      auVar12[5] = -((*pauVar3)[5] == local_208[5]);
      auVar12[6] = -((*pauVar3)[6] == local_208[6]);
      auVar12[7] = -((*pauVar3)[7] == local_208[7]);
      auVar12[8] = -((*pauVar3)[8] == local_208[8]);
      auVar12[9] = -((*pauVar3)[9] == local_208[9]);
      auVar12[10] = -((*pauVar3)[10] == local_208[10]);
      auVar12[0xb] = -((*pauVar3)[0xb] == local_208[0xb]);
      auVar12[0xc] = -((*pauVar3)[0xc] == local_208[0xc]);
      auVar12[0xd] = -((*pauVar3)[0xd] == local_208[0xd]);
      auVar12[0xe] = -((*pauVar3)[0xe] == local_208[0xe]);
      auVar12[0xf] = -((*pauVar3)[0xf] == local_208[0xf]);
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010ade4;
      pcVar4 = "passed";
      if (verbose != 0) goto LAB_0010aa87;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar9 = 0;
  do {
    uVar5 = uVar9 >> 1;
    uVar8 = uVar5 * 0x40 + 0x80;
    mode = uVar9 & 1;
    if (verbose != 0) {
      pcVar4 = "enc";
      if (mode == 0) {
        pcVar4 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)uVar8,pcVar4);
    }
    local_1c8[8] = '\b';
    local_1c8[9] = '\t';
    local_1c8[10] = '\n';
    local_1c8[0xb] = '\v';
    local_1c8[0xc] = '\f';
    local_1c8[0xd] = '\r';
    local_1c8[0xe] = '\x0e';
    local_1c8[0xf] = '\x0f';
    local_1c8[0] = '\0';
    local_1c8[1] = '\x01';
    local_1c8[2] = '\x02';
    local_1c8[3] = '\x03';
    local_1c8[4] = '\x04';
    local_1c8[5] = '\x05';
    local_1c8[6] = '\x06';
    local_1c8[7] = '\a';
    memcpy(local_1b8,aes_test_cfb128_key + uVar5,(ulong)(uVar8 >> 3));
    local_210 = 0;
    iVar1 = mbedtls_aes_setkey_enc(&local_168,local_1b8,uVar8);
    pcVar4 = "skipped";
    if (uVar8 == 0xc0 && iVar1 == -0x23) {
LAB_0010ac38:
      puts(pcVar4);
    }
    else {
      if (iVar1 != 0) goto LAB_0010ada4;
      if (mode == 0) {
        local_208 = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar5];
        local_1f8._0_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar5] + 0x10);
        local_1f8._8_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar5] + 0x18);
        local_1f8._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar5] + 0x20);
        local_1f8._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar5] + 0x28);
        local_1f8._32_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar5] + 0x30);
        local_1f8._40_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar5] + 0x38);
        __s2 = aes_test_cfb128_pt;
      }
      else {
        local_1f8[0x20] = 0xf6;
        local_1f8[0x21] = 0x9f;
        local_1f8[0x22] = '$';
        local_1f8[0x23] = 'E';
        local_1f8[0x24] = 0xdf;
        local_1f8[0x25] = 'O';
        local_1f8[0x26] = 0x9b;
        local_1f8[0x27] = '\x17';
        local_1f8[0x28] = 0xad;
        local_1f8[0x29] = '+';
        local_1f8[0x2a] = 'A';
        local_1f8[0x2b] = '{';
        local_1f8[0x2c] = 0xe6;
        local_1f8[0x2d] = 'l';
        local_1f8[0x2e] = '7';
        local_1f8[0x2f] = '\x10';
        local_1f8[0x10] = '0';
        local_1f8[0x11] = 200;
        local_1f8[0x12] = '\x1c';
        local_1f8[0x13] = 'F';
        local_1f8[0x14] = 0xa3;
        local_1f8[0x15] = '\\';
        local_1f8[0x16] = 0xe4;
        local_1f8[0x17] = '\x11';
        local_1f8[0x18] = 0xe5;
        local_1f8[0x19] = 0xfb;
        local_1f8[0x1a] = 0xc1;
        local_1f8[0x1b] = '\x19';
        local_1f8[0x1c] = '\x1a';
        local_1f8[0x1d] = '\n';
        local_1f8[0x1e] = 'R';
        local_1f8[0x1f] = 0xef;
        local_1f8[0] = 0xae;
        local_1f8[1] = '-';
        local_1f8[2] = 0x8a;
        local_1f8[3] = 'W';
        local_1f8[4] = '\x1e';
        local_1f8[5] = '\x03';
        local_1f8[6] = 0xac;
        local_1f8[7] = 0x9c;
        local_1f8[8] = 0x9e;
        local_1f8[9] = 0xb7;
        local_1f8[10] = 'o';
        local_1f8[0xb] = 0xac;
        local_1f8[0xc] = 'E';
        local_1f8[0xd] = 0xaf;
        local_1f8[0xe] = 0x8e;
        local_1f8[0xf] = 'Q';
        local_208[8] = 0xe9;
        local_208[9] = '=';
        local_208[10] = '~';
        local_208[0xb] = '\x11';
        local_208[0xc] = 's';
        local_208[0xd] = 0x93;
        local_208[0xe] = '\x17';
        local_208[0xf] = '*';
        local_208[0] = 'k';
        local_208[1] = 0xc1;
        local_208[2] = 0xbe;
        local_208[3] = 0xe2;
        local_208[4] = '.';
        local_208[5] = '@';
        local_208[6] = 0x9f;
        local_208[7] = 0x96;
        __s2 = aes_test_cfb128_ct[uVar5];
      }
      mbedtls_aes_crypt_cfb128(&local_168,mode,0x40,&local_210,local_1c8,local_208,local_208);
      iVar1 = bcmp(local_208,__s2,0x40);
      if (iVar1 != 0) goto LAB_0010ade4;
      pcVar4 = "passed";
      if (verbose != 0) goto LAB_0010ac38;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  if (verbose != 0) {
    putchar(10);
  }
  uVar9 = 0;
  do {
    if (verbose != 0) {
      pcVar4 = "enc";
      if ((uVar9 & 1) == 0) {
        pcVar4 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar4);
    }
    uVar5 = uVar9 >> 1;
    local_188 = *(undefined8 *)aes_test_ctr_nonce_counter[uVar5];
    uStack_180 = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar5] + 8);
    local_1b8 = aes_test_ctr_key[uVar5];
    local_210 = 0;
    iVar1 = mbedtls_aes_setkey_enc(&local_168,local_1b8,0x80);
    if (iVar1 != 0) goto LAB_0010ada4;
    __n = (size_t)aes_test_ctr_len[uVar5];
    pauVar7 = aes_test_ctr_pt;
    pauVar6 = aes_test_ctr_ct;
    if ((uVar9 & 1) == 0) {
      pauVar7 = aes_test_ctr_ct;
      pauVar6 = aes_test_ctr_pt;
    }
    memcpy(local_208,pauVar7 + uVar5,__n);
    mbedtls_aes_crypt_ctr
              (&local_168,__n,&local_210,(uchar *)&local_188,local_178,local_208,local_208);
    iVar1 = bcmp(local_208,pauVar6 + uVar5,__n);
    if (iVar1 != 0) goto LAB_0010ade4;
    if (verbose != 0) {
      puts("passed");
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  iVar1 = 0;
  if (verbose != 0) {
    putchar(10);
  }
LAB_0010ada4:
  if ((verbose != 0) && (iVar1 != 0)) {
    puts("failed");
  }
  lVar2 = 0;
  do {
    *(undefined1 *)((long)local_168.buf + lVar2 + -0x10) = 0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x120);
  return iVar1;
LAB_0010ade4:
  iVar1 = 1;
  goto LAB_0010ada4;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    int len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}